

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O1

LogStream * __thiscall sznet::LogStream::operator<<(LogStream *this,short v)

{
  char **ppcVar1;
  char *buf;
  size_t sVar2;
  
  ppcVar1 = &(this->m_buffer).m_cur;
  buf = (this->m_buffer).m_cur;
  if (0x1f < (int)ppcVar1 - (int)buf) {
    sVar2 = detail::convert<int>(buf,(int)v);
    *ppcVar1 = *ppcVar1 + sVar2;
  }
  return this;
}

Assistant:

LogStream& LogStream::operator<<(short v)
{
	*this << static_cast<int>(v);
	return *this;
}